

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O2

int32_t ultag_getExtensionsSize(ULanguageTag *langtag)

{
  int iVar1;
  ExtensionListEntry **ppEVar2;
  
  ppEVar2 = &langtag->extensions;
  iVar1 = 0;
  while( true ) {
    if (*ppEVar2 == (ExtensionListEntry *)0x0) break;
    iVar1 = iVar1 + 1;
    ppEVar2 = &(*ppEVar2)->next;
  }
  return iVar1;
}

Assistant:

static int32_t
ultag_getExtensionsSize(const ULanguageTag* langtag) {
    int32_t size = 0;
    ExtensionListEntry *cur = langtag->extensions;
    while (TRUE) {
        if (cur == NULL) {
            break;
        }
        size++;
        cur = cur->next;
    }
    return size;
}